

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

bool __thiscall Gluco::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int i;
  long lVar5;
  lbool local_2b;
  lbool local_2a;
  lbool local_29;
  
  if (this->incremental == 0) {
    lVar5 = 0;
    do {
      lVar4 = (long)*(int *)&(c->header).field_0x4;
      bVar3 = lVar5 < lVar4;
      if (lVar4 <= lVar5) {
        return bVar3;
      }
      iVar1 = *(int *)(&c[1].header.field_0x0 + lVar5 * 4);
      local_2b.value = (byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value;
      bVar2 = lbool::operator==(&local_2b,(lbool)0x0);
      lVar5 = lVar5 + 1;
    } while (!bVar2);
  }
  else {
    local_29.value =
         (byte)*(int *)&c[1].header & 1 ^ (this->assigns).data[*(int *)&c[1].header >> 1].value;
    bVar2 = lbool::operator==(&local_29,(lbool)0x0);
    bVar3 = true;
    if (!bVar2) {
      iVar1 = *(int *)&c[1].header.field_0x4;
      local_2a.value = (byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value;
      bVar3 = lbool::operator==(&local_2a,(lbool)0x0);
    }
  }
  return bVar3;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
  if(incremental)  // Check clauses with many selectors is too time consuming
    return (value(c[0]) == l_True) || (value(c[1]) == l_True);

  // Default mode.
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; 
}